

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling.cpp
# Opt level: O2

void pbrt::PiecewiseConstant2D::TestCompareDistributions
               (PiecewiseConstant2D *da,PiecewiseConstant2D *db,Float eps)

{
  char *pcVar1;
  size_t i;
  ulong uVar2;
  long lVar3;
  AssertHelper local_48;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_40;
  AssertionResult gtest_ar;
  
  PiecewiseConstant1D::TestCompareDistributions(&da->pMarginal,&db->pMarginal,eps);
  local_40.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       (da->pConditionalY).nStored;
  local_48.data_ = (AssertHelperData *)(db->pConditionalY).nStored;
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&gtest_ar,"da.pConditionalY.size()","db.pConditionalY.size()",
             (unsigned_long *)&local_40,(unsigned_long *)&local_48);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_40);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_48,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/sampling.cpp"
               ,0x23a,pcVar1);
    testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_40);
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
    testing::internal::CmpHelperEQ<pbrt::Bounds2<float>,pbrt::Bounds2<float>>
              ((internal *)&gtest_ar,"da.domain","db.domain",&da->domain,&db->domain);
    if (gtest_ar.success_ != false) {
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar.message_);
      lVar3 = 0;
      for (uVar2 = 0; uVar2 < (da->pConditionalY).nStored; uVar2 = uVar2 + 1) {
        PiecewiseConstant1D::TestCompareDistributions
                  ((PiecewiseConstant1D *)
                   ((long)&(((da->pConditionalY).ptr)->func).alloc.memoryResource + lVar3),
                   (PiecewiseConstant1D *)
                   ((long)&(((db->pConditionalY).ptr)->func).alloc.memoryResource + lVar3),eps);
        lVar3 = lVar3 + 0x50;
      }
      return;
    }
    testing::Message::Message((Message *)&local_40);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_48,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/sampling.cpp"
               ,0x23b,pcVar1);
    testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_40);
  }
  testing::internal::AssertHelper::~AssertHelper(&local_48);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr(&local_40);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  return;
}

Assistant:

void PiecewiseConstant2D::TestCompareDistributions(const PiecewiseConstant2D &da,
                                                   const PiecewiseConstant2D &db,
                                                   Float eps) {
    PiecewiseConstant1D::TestCompareDistributions(da.pMarginal, db.pMarginal, eps);

    ASSERT_EQ(da.pConditionalY.size(), db.pConditionalY.size());
    ASSERT_EQ(da.domain, db.domain);
    for (size_t i = 0; i < da.pConditionalY.size(); ++i)
        PiecewiseConstant1D::TestCompareDistributions(da.pConditionalY[i],
                                                      db.pConditionalY[i], eps);
}